

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Empty.hpp
# Opt level: O2

string * __thiscall
ut11::Operands::IsEmpty::GetErrorMessage<std::__cxx11::string>
          (string *__return_storage_ptr__,IsEmpty *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  ostream *poVar1;
  stringstream errorMessage;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Expected empty but was ");
  std::__cxx11::string::string(local_1c0,(string *)actual);
  std::operator<<(poVar1,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const U& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected empty but was " << utility::ToString(actual);
				return errorMessage.str();
			}